

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O0

void __thiscall XPMP2::SoundSystemFMOD::SetAllMute(SoundSystemFMOD *this,bool bMute)

{
  byte in_SIL;
  long in_RDI;
  undefined4 in_stack_fffffffffffffef0;
  int iVar1;
  allocator<char> local_f1;
  string local_f0 [16];
  FmodError *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  string local_c8 [32];
  string *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  string local_90 [4];
  FMOD_RESULT in_stack_ffffffffffffff74;
  string *in_stack_ffffffffffffff78;
  FmodError *in_stack_ffffffffffffff80;
  
  gFmodRes = FMOD_ChannelGroup_SetMute(*(undefined8 *)(in_RDI + 0x90),in_SIL & 1);
  if (gFmodRes != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (allocator<char> *)in_stack_ffffffffffffff20);
    iVar1 = gFmodRes;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (allocator<char> *)in_stack_ffffffffffffff20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (allocator<char> *)in_stack_ffffffffffffff20);
    FmodError::FmodError
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff58);
    FmodError::LogErr(in_stack_ffffffffffffff20);
    FmodError::~FmodError((FmodError *)CONCAT44(iVar1,in_stack_fffffffffffffef0));
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator(&local_f1);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  }
  return;
}

Assistant:

void SoundSystemFMOD::SetAllMute (bool bMute)
{
    FMOD_LOG(FMOD_ChannelGroup_SetMute(pChnGrp, bMute));
}